

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O1

void VW::finish_example(vw *all,multi_ex *ec_seq)

{
  pointer ppeVar1;
  multi_ex *__range1;
  pointer ppeVar2;
  
  ppeVar1 = (ec_seq->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
            super__Vector_impl_data._M_finish;
  for (ppeVar2 = (ec_seq->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
                 super__Vector_impl_data._M_start; ppeVar2 != ppeVar1; ppeVar2 = ppeVar2 + 1) {
    finish_example(all,*ppeVar2);
  }
  ppeVar2 = (ec_seq->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
            super__Vector_impl_data._M_start;
  if ((ec_seq->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
      super__Vector_impl_data._M_finish != ppeVar2) {
    (ec_seq->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
    super__Vector_impl_data._M_finish = ppeVar2;
  }
  return;
}

Assistant:

void finish_example(vw& all, multi_ex& ec_seq)
{
  for (auto ec : ec_seq) finish_example(all, *ec);
  ec_seq.clear();
}